

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

void __thiscall
HEkk::debugReportReinvertOnNumericalTrouble
          (HEkk *this,string *method_name,double numerical_trouble_measure,double alpha_from_col,
          double alpha_from_row,double numerical_trouble_tolerance,bool reinvert)

{
  uint uVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  double dVar4;
  string adjective;
  string model_name;
  
  if (0 < (this->options_->super_HighsOptionsStruct).highs_debug_level) {
    uVar1 = this->iteration_count_;
    uVar2 = (this->info_).update_count;
    std::__cxx11::string::string((string *)&model_name,(string *)&(this->lp_).model_name_);
    dVar4 = alpha_from_col * alpha_from_row;
    if ((numerical_trouble_tolerance < numerical_trouble_measure * 10.0) || (dVar4 <= 0.0)) {
      adjective._M_dataplus._M_p = (pointer)&adjective.field_2;
      adjective._M_string_length = 0;
      adjective.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)&adjective);
      _Var3._M_p = adjective._M_dataplus._M_p;
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                  "%s (%s) [Iter %d; Update %d] Col: %11.4g; Row: %11.4g; Diff = %11.4g: Measure %11.4g %s %11.4g\n"
                  ,ABS(alpha_from_col),ABS(alpha_from_row),
                  ABS(ABS(alpha_from_col) - ABS(alpha_from_row)),numerical_trouble_measure,
                  numerical_trouble_tolerance,(method_name->_M_dataplus)._M_p,
                  model_name._M_dataplus._M_p,(ulong)uVar1,(ulong)uVar2);
      if (dVar4 <= 0.0) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "   Incompatible signs for Col: %11.4g and Row: %11.4g\n",alpha_from_col,
                    alpha_from_row,_Var3._M_p);
      }
      if (((-(numerical_trouble_measure <= numerical_trouble_tolerance && 0.0 < dVar4) | reinvert) &
          1U) == 0) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                    "   Numerical trouble or wrong sign and not reinverting\n");
      }
      std::__cxx11::string::~string((string *)&adjective);
    }
    std::__cxx11::string::~string((string *)&model_name);
  }
  return;
}

Assistant:

void HEkk::debugReportReinvertOnNumericalTrouble(
    const std::string method_name, const double numerical_trouble_measure,
    const double alpha_from_col, const double alpha_from_row,
    const double numerical_trouble_tolerance, const bool reinvert) const {
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap) return;
  const double abs_alpha_from_col = abs(alpha_from_col);
  const double abs_alpha_from_row = abs(alpha_from_row);
  const double abs_alpha_diff = abs(abs_alpha_from_col - abs_alpha_from_row);
  const HighsInt iteration_count = this->iteration_count_;
  const HighsInt update_count = this->info_.update_count;
  const std::string model_name = this->lp_.model_name_;

  const bool numerical_trouble =
      numerical_trouble_measure > numerical_trouble_tolerance;
  const bool near_numerical_trouble =
      10 * numerical_trouble_measure > numerical_trouble_tolerance;

  const bool wrong_sign = alpha_from_col * alpha_from_row <= 0;
  if (!near_numerical_trouble && !wrong_sign) return;
  std::string adjective;
  if (numerical_trouble) {
    adjective = "       exceeds";
  } else if (near_numerical_trouble) {
    adjective = "almost exceeds";
  } else {
    adjective = "clearly satisfies";
  }
  highsLogDev(this->options_->log_options, HighsLogType::kWarning,
              "%s (%s) [Iter %" HIGHSINT_FORMAT "; Update %" HIGHSINT_FORMAT
              "] Col: %11.4g; Row: %11.4g; Diff "
              "= %11.4g: Measure %11.4g %s %11.4g\n",
              method_name.c_str(), model_name.c_str(), iteration_count,
              update_count, abs_alpha_from_col, abs_alpha_from_row,
              abs_alpha_diff, numerical_trouble_measure, adjective.c_str(),
              numerical_trouble_tolerance);
  if (wrong_sign) {
    highsLogDev(this->options_->log_options, HighsLogType::kWarning,
                "   Incompatible signs for Col: %11.4g and Row: %11.4g\n",
                alpha_from_col, alpha_from_row);
  }
  if ((numerical_trouble || wrong_sign) && !reinvert) {
    highsLogDev(this->options_->log_options, HighsLogType::kWarning,
                "   Numerical trouble or wrong sign and not reinverting\n");
  }
}